

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O0

bool __thiscall duckdb::AsOfProbeBuffer::NextLeft(AsOfProbeBuffer *this)

{
  bool bVar1;
  pointer this_00;
  AsOfProbeBuffer *in_RDI;
  DataChunk *in_stack_00000040;
  DataChunk *in_stack_ffffffffffffffd8;
  unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
  *in_stack_ffffffffffffffe0;
  AsOfProbeBuffer *this_01;
  
  this_01 = in_RDI;
  bVar1 = HasMoreData(in_RDI);
  if (bVar1) {
    DataChunk::Reset(in_stack_00000040);
    this_00 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
              operator->(in_stack_ffffffffffffffe0);
    unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
    operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                *)this_00);
    PayloadScanner::Scanned((PayloadScanner *)0x17fe643);
    SBIterator::SetIndex((SBIterator *)this_01,(idx_t)in_RDI);
    unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
    operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                *)this_00);
    PayloadScanner::Scan((PayloadScanner *)this_00,in_stack_ffffffffffffffd8);
  }
  return bVar1;
}

Assistant:

bool AsOfProbeBuffer::NextLeft() {
	if (!HasMoreData()) {
		return false;
	}

	//	Scan the next sorted chunk
	lhs_payload.Reset();
	left_itr->SetIndex(lhs_scanner->Scanned());
	lhs_scanner->Scan(lhs_payload);

	return true;
}